

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

bool __thiscall CppJieba::Trie::_insert(Trie *this,TrieNodeInfo *nodeInfo)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  mapped_type pTVar6;
  mapped_type *ppTVar7;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RSI;
  Trie *in_RDI;
  bad_alloc *e;
  TrieNode *next;
  uint16_t cu;
  uint i;
  TrieNode *p;
  Unicode *uintVec;
  unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
  *in_stack_fffffffffffffef8;
  TrieNode *in_stack_ffffffffffffff00;
  value_type *in_stack_ffffffffffffff08;
  allocator *paVar8;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *in_stack_ffffffffffffff10
  ;
  char *local_c0;
  allocator local_a9;
  string local_a8 [40];
  mapped_type local_80;
  _Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false> local_78;
  _Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false> local_70;
  value_type local_66;
  uint local_64;
  mapped_type local_60;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_58;
  allocator local_39;
  string local_38 [32];
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = _getInitFlag(in_RDI);
  if (bVar1) {
    local_58 = local_18;
    local_60 = in_RDI->_root;
    for (local_64 = 0; uVar3 = (ulong)local_64,
        sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(local_58),
        uVar3 < sVar4; local_64 = local_64 + 1) {
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (local_58,(ulong)local_64);
      local_66 = *pvVar5;
      if (local_60 == (mapped_type)0x0) {
        return false;
      }
      local_70._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
           ::end(in_stack_fffffffffffffef8);
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
           ::find(in_stack_fffffffffffffef8,(key_type *)0x139fd2);
      bVar1 = std::__detail::operator==(&local_70,&local_78);
      if (bVar1) {
        local_80 = (mapped_type)0x0;
        pTVar6 = (mapped_type)operator_new(0x40);
        TrieNode::TrieNode(in_stack_ffffffffffffff00);
        local_80 = pTVar6;
        ppTVar7 = std::
                  unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
                  ::operator[](&in_stack_ffffffffffffff00->hmap,
                               (key_type *)in_stack_fffffffffffffef8);
        *ppTVar7 = pTVar6;
        local_60 = local_80;
      }
      else {
        ppTVar7 = std::
                  unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
                  ::operator[](&in_stack_ffffffffffffff00->hmap,
                               (key_type *)in_stack_fffffffffffffef8);
        local_60 = *ppTVar7;
      }
    }
    if (local_60 == (mapped_type)0x0) {
      local_1 = false;
    }
    else if ((local_60->isLeaf & 1U) == 0) {
      local_60->isLeaf = true;
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      sVar4 = std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::size
                        (&in_RDI->_nodeInfoVec);
      local_60->nodeInfoVecPos = (int)sVar4 - 1;
      local_1 = true;
    }
    else {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
      }
      else {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                         ,0x2f);
        pcVar2 = pcVar2 + 1;
      }
      paVar8 = &local_a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"this node already _inserted",paVar8);
      Limonp::Logger::LoggingF(3,pcVar2,0x12f,(string *)local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      local_1 = false;
    }
  }
  else {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
    }
    else {
      local_c0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                         ,0x2f);
      local_c0 = local_c0 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"not initted!",&local_39);
    Limonp::Logger::LoggingF(4,local_c0,0x108,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool _insert(const TrieNodeInfo& nodeInfo)
            {
                if(!_getInitFlag())
                {
                    LogFatal("not initted!");
                    return false;
                }


                const Unicode& uintVec = nodeInfo.word;
                TrieNode* p = _root;
                for(uint i = 0; i < uintVec.size(); i++)
                {
                    uint16_t cu = uintVec[i];
                    if(NULL == p)
                    {
                        return false;
                    }
                    if(p->hmap.end() == p->hmap.find(cu))
                    {
                        TrieNode * next = NULL;
                        try
                        {
                            next = new TrieNode;
                        }
                        catch(const bad_alloc& e)
                        {
                            return false;
                        }
                        p->hmap[cu] = next;
                        p = next;
                    }
                    else
                    {
                        p = p->hmap[cu];
                    }
                }
                if(NULL == p)
                {
                    return false;
                }
                if(p->isLeaf)
                {
                    LogError("this node already _inserted");
                    return false;
                }

                p->isLeaf = true;
                _nodeInfoVec.push_back(nodeInfo);
                p->nodeInfoVecPos = _nodeInfoVec.size() - 1;

                return true;
            }